

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

int __thiscall
slang::SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::copy
          (SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> *this,
          EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  StreamExpression *__ofirst;
  
  if (this->len == 0) {
    __ofirst = (StreamExpression *)0x0;
  }
  else {
    __ofirst = (StreamExpression *)BumpAllocator::allocate((BumpAllocator *)dst,this->len * 0x18,8);
    std::ranges::__uninitialized_copy_fn::
    operator()<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_slang::ast::StreamingConcatenationExpression::StreamExpression_*>
              ((__uninitialized_copy_fn *)&std::ranges::uninitialized_copy,this->data_,
               this->data_ + this->len,__ofirst,__ofirst + this->len);
  }
  return (int)__ofirst;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }